

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O2

void __thiscall
HighsSimplexAnalysis::operationRecordAfter
          (HighsSimplexAnalysis *this,HighsInt operation_type,HighsInt result_count)

{
  HighsInt *pHVar1;
  double dVar2;
  double __x;
  
  __x = (double)result_count / (double)this->AnIterOp[operation_type].AnIterOpRsDim;
  if (__x <= 0.1) {
    pHVar1 = &this->AnIterOp[operation_type].AnIterOpNumHyperRs;
    *pHVar1 = *pHVar1 + 1;
  }
  if (0.0 < __x) {
    dVar2 = log(__x);
    this->AnIterOp[operation_type].AnIterOpSumLog10RsDensity =
         dVar2 / 2.302585092994046 + this->AnIterOp[operation_type].AnIterOpSumLog10RsDensity;
  }
  updateValueDistribution(__x,&this->AnIterOp[operation_type].AnIterOp_density);
  return;
}

Assistant:

void HighsSimplexAnalysis::operationRecordAfter(const HighsInt operation_type,
                                                const HighsInt result_count) {
  AnIterOpRec& AnIter = AnIterOp[operation_type];
  const double result_density = 1.0 * result_count / AnIter.AnIterOpRsDim;
  if (result_density <= kHyperResult) AnIter.AnIterOpNumHyperRs++;
  if (result_density > 0) {
    AnIter.AnIterOpSumLog10RsDensity += log(result_density) / log(10.0);
  } else {
    /*
    // TODO Investigate these zero norms
    double vectorNorm = 0;

    for (HighsInt index = 0; index < AnIter.AnIterOpRsDim; index++) {
      double vectorValue = vector.array[index];
      vectorNorm += vectorValue * vectorValue;
    }
    vectorNorm = sqrt(vectorNorm);
    printf("Strange: operation %s has result density = %g: ||vector|| = %g\n",
    AnIter.AnIterOpName.c_str(), result_density, vectorNorm);
    */
  }
  updateValueDistribution(result_density, AnIter.AnIterOp_density);
}